

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap-linux.c
# Opt level: O3

int is_wifi(int sock_fd,char *device)

{
  int iVar1;
  uint uVar2;
  char *pathstr;
  stat statb;
  char errbuf [256];
  char *local_1b0;
  stat local_1a8;
  char local_118 [256];
  
  uVar2 = 0;
  iVar1 = asprintf(&local_1b0,"/sys/class/net/%s/wireless",device);
  if (iVar1 != -1) {
    iVar1 = stat(local_1b0,&local_1a8);
    free(local_1b0);
    if (iVar1 == 0) {
      uVar2 = 1;
    }
    else {
      iVar1 = has_wext(sock_fd,device,local_118);
      uVar2 = (uint)(iVar1 == 1);
    }
  }
  return uVar2;
}

Assistant:

static int
is_wifi(int sock_fd
#ifndef IW_MODE_MONITOR
_U_
#endif
, const char *device)
{
	char *pathstr;
	struct stat statb;
#ifdef IW_MODE_MONITOR
	char errbuf[PCAP_ERRBUF_SIZE];
#endif

	/*
	 * See if there's a sysfs wireless directory for it.
	 * If so, it's a wireless interface.
	 */
	if (asprintf(&pathstr, "/sys/class/net/%s/wireless", device) == -1) {
		/*
		 * Just give up here.
		 */
		return 0;
	}
	if (stat(pathstr, &statb) == 0) {
		free(pathstr);
		return 1;
	}
	free(pathstr);

#ifdef IW_MODE_MONITOR
	/*
	 * OK, maybe it's not wireless, or maybe this kernel doesn't
	 * support sysfs.  Try the wireless extensions.
	 */
	if (has_wext(sock_fd, device, errbuf) == 1) {
		/*
		 * It supports the wireless extensions, so it's a Wi-Fi
		 * device.
		 */
		return 1;
	}
#endif
	return 0;
}